

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O3

IntRect __thiscall sf::Font::findGlyphRect(Font *this,Page *page,uint width,uint height)

{
  Texture *this_00;
  uint uVar1;
  iterator __position;
  uint uVar2;
  Vector2u VVar3;
  Vector2u VVar4;
  ostream *poVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint height_00;
  pointer pRVar8;
  uint uVar9;
  float fVar10;
  IntRect IVar11;
  Texture newTexture;
  Texture local_58;
  
  pRVar8 = (page->rows).super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pRVar8 != (page->rows).super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    do {
      fVar10 = (float)height / (float)pRVar8->height;
      if ((0.7 <= fVar10) && (fVar10 <= 1.0)) {
        VVar3 = Texture::getSize(&page->texture);
        if (width <= VVar3.x - pRVar8->width) goto LAB_0015b685;
      }
      pRVar8 = pRVar8 + 1;
    } while (pRVar8 != (page->rows).
                       super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  uVar9 = (uint)((ulong)height * 0x8cccccccd >> 0x23);
  this_00 = &page->texture;
  do {
    uVar1 = page->nextRow;
    VVar3 = Texture::getSize(this_00);
    if (uVar1 + uVar9 < VVar3.y) {
      VVar3 = Texture::getSize(this_00);
      if (width < VVar3.x) {
        local_58.m_size.y = page->nextRow;
        local_58.m_size.x = 0;
        __position._M_current =
             (page->rows).super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (page->rows).super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_58.m_actualSize.x = uVar9;
          std::vector<sf::Font::Row,_std::allocator<sf::Font::Row>_>::
          _M_realloc_insert<sf::Font::Row>(&page->rows,__position,(Row *)&local_58);
          pRVar8 = (page->rows).super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (__position._M_current)->height = uVar9;
          (__position._M_current)->width = (int)((ulong)local_58.m_size.y << 0x20);
          (__position._M_current)->top = (int)(((ulong)local_58.m_size.y << 0x20) >> 0x20);
          pRVar8 = (page->rows).super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
          (page->rows).super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>._M_impl.
          super__Vector_impl_data._M_finish = pRVar8;
        }
        page->nextRow = page->nextRow + uVar9;
        pRVar8 = pRVar8 + -1;
LAB_0015b685:
        uVar6._0_4_ = pRVar8->width;
        uVar6._4_4_ = pRVar8->top;
        pRVar8->width = (undefined4)uVar6 + width;
        uVar7 = CONCAT44(height,width);
        goto LAB_0015b69b;
      }
    }
    VVar3 = Texture::getSize(this_00);
    VVar4 = Texture::getSize(this_00);
    uVar1 = VVar3.x * 2;
    uVar2 = Texture::getMaximumSize();
    if (uVar2 < uVar1) {
LAB_0015b5d4:
      poVar5 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,
                 "Failed to add a new character to the font: the maximum texture size has been reached"
                 ,0x54);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      uVar7 = 0x200000002;
      uVar6 = 0;
LAB_0015b69b:
      IVar11.width = (int)uVar7;
      IVar11.height = (int)((ulong)uVar7 >> 0x20);
      IVar11.left = (int)uVar6;
      IVar11.top = (int)((ulong)uVar6 >> 0x20);
      return IVar11;
    }
    height_00 = (uint)((ulong)VVar4 >> 0x1f) & 0xfffffffe;
    uVar2 = Texture::getMaximumSize();
    if (uVar2 < height_00) goto LAB_0015b5d4;
    Texture::Texture(&local_58);
    Texture::create(&local_58,uVar1,height_00);
    Texture::setSmooth(&local_58,this->m_isSmooth);
    Texture::update(&local_58,this_00);
    Texture::swap(this_00,&local_58);
    Texture::~Texture(&local_58);
  } while( true );
}

Assistant:

IntRect Font::findGlyphRect(Page& page, unsigned int width, unsigned int height) const
{
    // Find the line that fits well the glyph
    Row* row = NULL;
    float bestRatio = 0;
    for (std::vector<Row>::iterator it = page.rows.begin(); it != page.rows.end() && !row; ++it)
    {
        float ratio = static_cast<float>(height) / static_cast<float>(it->height);

        // Ignore rows that are either too small or too high
        if ((ratio < 0.7f) || (ratio > 1.f))
            continue;

        // Check if there's enough horizontal space left in the row
        if (width > page.texture.getSize().x - it->width)
            continue;

        // Make sure that this new row is the best found so far
        if (ratio < bestRatio)
            continue;

        // The current row passed all the tests: we can select it
        row = &*it;
        bestRatio = ratio;
    }

    // If we didn't find a matching row, create a new one (10% taller than the glyph)
    if (!row)
    {
        unsigned int rowHeight = height + height / 10;
        while ((page.nextRow + rowHeight >= page.texture.getSize().y) || (width >= page.texture.getSize().x))
        {
            // Not enough space: resize the texture if possible
            unsigned int textureWidth  = page.texture.getSize().x;
            unsigned int textureHeight = page.texture.getSize().y;
            if ((textureWidth * 2 <= Texture::getMaximumSize()) && (textureHeight * 2 <= Texture::getMaximumSize()))
            {
                // Make the texture 2 times bigger
                Texture newTexture;
                newTexture.create(textureWidth * 2, textureHeight * 2);
                newTexture.setSmooth(m_isSmooth);
                newTexture.update(page.texture);
                page.texture.swap(newTexture);
            }
            else
            {
                // Oops, we've reached the maximum texture size...
                err() << "Failed to add a new character to the font: the maximum texture size has been reached" << std::endl;
                return IntRect(0, 0, 2, 2);
            }
        }

        // We can now create the new row
        page.rows.push_back(Row(page.nextRow, rowHeight));
        page.nextRow += rowHeight;
        row = &page.rows.back();
    }

    // Find the glyph's rectangle on the selected row
    IntRect rect(Rect<unsigned int>(row->width, row->top, width, height));

    // Update the row informations
    row->width += width;

    return rect;
}